

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

AddPropertyCacheBucket * __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Get
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,int value)

{
  SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  code *pcVar2;
  Bucket<AddPropertyCacheBucket> *this_00;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type_conflict node;
  Bucket<AddPropertyCacheBucket> *bucket;
  Iterator __iter;
  int value_local;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this_local;
  
  pSVar1 = this->table;
  __iter.current._4_4_ = value;
  uVar4 = Hash(this,value);
  _bucket = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
            GetIterator(pSVar1 + uVar4);
  do {
    if (__iter.list ==
        (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_00 = bucket;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)this_00,node);
    if (bVar3) goto LAB_004eedd1;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    this_local = (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)
                 SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                 Iterator::Data((Iterator *)&bucket);
  } while (__iter.current._4_4_ < ((Type *)this_local)->value);
  if (((Type *)this_local)->value != __iter.current._4_4_) {
LAB_004eedd1:
    this_local = (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0;
  }
  return (AddPropertyCacheBucket *)this_local;
}

Assistant:

T * Get(int value)
    {
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(Bucket<T>, bucket, &this->table[this->Hash(value)])
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return nullptr;
    }